

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cpp
# Opt level: O0

bool Fossilize::filter_extension
               (char *ext,bool want_amd_shader_info,
               vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *all_exts,
               uint32_t api_version)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  char *candidate;
  char **__end1;
  char **__begin1;
  char *(*__range1) [13];
  bool ext_is_vulkan_11_only;
  uint32_t api_version_local;
  vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *all_exts_local;
  bool want_amd_shader_info_local;
  char *ext_local;
  
  bVar1 = false;
  __end1 = filter_extension::vulkan_11_only_extensions;
  do {
    if (__end1 == (char **)&DAT_0014a208) {
LAB_00106f31:
      iVar3 = strcmp(ext,"VK_AMD_negative_viewport_height");
      if (iVar3 == 0) {
        ext_local._7_1_ = false;
      }
      else {
        iVar3 = strcmp(ext,"VK_NV_ray_tracing");
        if (iVar3 == 0) {
          ext_local._7_1_ = false;
        }
        else {
          iVar3 = strcmp(ext,"VK_EXT_buffer_device_address");
          if ((iVar3 == 0) &&
             (bVar2 = find_extension(all_exts,"VK_KHR_buffer_device_address"), bVar2)) {
            ext_local._7_1_ = false;
          }
          else if ((api_version < 0x401000) && (bVar1)) {
            ext_local._7_1_ = false;
          }
          else {
            iVar3 = strcmp(ext,"VK_AMD_shader_info");
            if ((iVar3 != 0) || (want_amd_shader_info)) {
              ext_local._7_1_ = true;
            }
            else {
              ext_local._7_1_ = false;
            }
          }
        }
      }
      return ext_local._7_1_;
    }
    iVar3 = strcmp(*__end1,ext);
    if (iVar3 == 0) {
      bVar1 = true;
      goto LAB_00106f31;
    }
    __end1 = __end1 + 1;
  } while( true );
}

Assistant:

static bool filter_extension(const char *ext, bool want_amd_shader_info,
                             const vector<VkExtensionProperties> &all_exts, uint32_t api_version)
{
	static const char *vulkan_11_only_extensions[] = {
		VK_KHR_SHADER_SUBGROUP_EXTENDED_TYPES_EXTENSION_NAME,
		VK_KHR_SPIRV_1_4_EXTENSION_NAME,
		VK_KHR_SHARED_PRESENTABLE_IMAGE_EXTENSION_NAME,
		VK_KHR_SHADER_FLOAT_CONTROLS_EXTENSION_NAME,
		VK_KHR_ACCELERATION_STRUCTURE_EXTENSION_NAME,
		VK_KHR_RAY_TRACING_PIPELINE_EXTENSION_NAME,
		VK_KHR_RAY_QUERY_EXTENSION_NAME,
		VK_KHR_MAINTENANCE_4_EXTENSION_NAME,
		VK_KHR_SHADER_SUBGROUP_UNIFORM_CONTROL_FLOW_EXTENSION_NAME,
		VK_EXT_SUBGROUP_SIZE_CONTROL_EXTENSION_NAME,
		VK_NV_SHADER_SM_BUILTINS_EXTENSION_NAME,
		VK_NV_SHADER_SUBGROUP_PARTITIONED_EXTENSION_NAME,
		VK_NV_DEVICE_GENERATED_COMMANDS_EXTENSION_NAME,
	};

	bool ext_is_vulkan_11_only = false;
	for (auto *candidate : vulkan_11_only_extensions)
	{
		if (strcmp(candidate, ext) == 0)
		{
			ext_is_vulkan_11_only = true;
			break;
		}
	}

	if (strcmp(ext, VK_AMD_NEGATIVE_VIEWPORT_HEIGHT_EXTENSION_NAME) == 0)
	{
		// AMD_negative_viewport_height: Obsolete, illegal to enable along maintenance1.
		return false;
	}
	else if (strcmp(ext, VK_NV_RAY_TRACING_EXTENSION_NAME) == 0)
	{
		// We never enable the features, and it is known to cause some shenanigans with pipeline replay.
		return false;
	}
	else if (strcmp(ext, VK_EXT_BUFFER_DEVICE_ADDRESS_EXTENSION_NAME) == 0 &&
	         find_extension(all_exts, VK_KHR_BUFFER_DEVICE_ADDRESS_EXTENSION_NAME))
	{
		// Cannot enable both EXT and KHR versions, validation complains.
		return false;
	}
	else if (api_version < VK_API_VERSION_1_1 && ext_is_vulkan_11_only)
	{
		return false;
	}
	else if (strcmp(ext, VK_AMD_SHADER_INFO_EXTENSION_NAME) == 0 && !want_amd_shader_info)
	{
		// Mesa disables the pipeline cache when VK_AMD_shader_info is used, so disable this extension unless we need it.
		return false;
	}

	return true;
}